

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::TrigFunc::innerExtrema
          (Interval *__return_storage_ptr__,TrigFunc *this,EvalContext *param_1,Interval *angle)

{
  double dVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  
  dVar5 = angle->m_lo;
  dVar1 = angle->m_hi;
  iVar2 = (*(this->super_CFloatFunc1).super_FloatFunc1.
            super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            .
            super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            .super_FuncBase._vptr_FuncBase[0x10])(this);
  iVar3 = (*(this->super_CFloatFunc1).super_FloatFunc1.
            super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            .
            super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            .super_FuncBase._vptr_FuncBase[0x10])(dVar1,this);
  if (6.283185307179586 <= angle->m_hi - angle->m_lo) {
LAB_0148a8b7:
    tcu::Interval::operator|(&this->m_hiExtremum,&this->m_loExtremum);
  }
  else {
    if (iVar3 == -1 && iVar2 == 1) {
      __return_storage_ptr__->m_hi = (this->m_hiExtremum).m_hi;
      uVar4 = *(undefined8 *)&this->m_hiExtremum;
      dVar5 = (this->m_hiExtremum).m_lo;
    }
    else {
      if (iVar3 != 1 || iVar2 != -1) {
        if (iVar2 != iVar3) {
LAB_0148a8a5:
          __return_storage_ptr__->m_hasNaN = false;
          __return_storage_ptr__->m_lo = INFINITY;
          __return_storage_ptr__->m_hi = -INFINITY;
          return __return_storage_ptr__;
        }
        (*(this->super_CFloatFunc1).super_FloatFunc1.
          super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .
          super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .super_FuncBase._vptr_FuncBase[0xd])(dVar1,this);
        (*(this->super_CFloatFunc1).super_FloatFunc1.
          super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .
          super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .super_FuncBase._vptr_FuncBase[0xd])(dVar5,this);
        if (((uint)(0.0 < extraout_XMM0_Qa - extraout_XMM0_Qa_00) -
            (uint)(extraout_XMM0_Qa - extraout_XMM0_Qa_00 < 0.0)) * iVar2 != -1) goto LAB_0148a8a5;
        goto LAB_0148a8b7;
      }
      __return_storage_ptr__->m_hi = (this->m_loExtremum).m_hi;
      uVar4 = *(undefined8 *)&this->m_loExtremum;
      dVar5 = (this->m_loExtremum).m_lo;
    }
    *(undefined8 *)__return_storage_ptr__ = uVar4;
    __return_storage_ptr__->m_lo = dVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

Interval		innerExtrema	(const EvalContext&, const Interval& angle) const
	{
		const double		lo		= angle.lo();
		const double		hi		= angle.hi();
		const int			loSlope	= doGetSlope(lo);
		const int			hiSlope	= doGetSlope(hi);

		// Detect the high and low values the function can take between the
		// interval endpoints.
		if (angle.length() >= 2.0 * DE_PI_DOUBLE)
		{
			// The interval is longer than a full cycle, so it must get all possible values.
			return m_hiExtremum | m_loExtremum;
		}
		else if (loSlope == 1 && hiSlope == -1)
		{
			// The slope can change from positive to negative only at the maximum value.
			return m_hiExtremum;
		}
		else if (loSlope == -1 && hiSlope == 1)
		{
			// The slope can change from negative to positive only at the maximum value.
			return m_loExtremum;
		}
		else if (loSlope == hiSlope &&
				 deIntSign(applyExact(hi) - applyExact(lo)) * loSlope == -1)
		{
			// The slope has changed twice between the endpoints, so both extrema are included.
			return m_hiExtremum | m_loExtremum;
		}

		return Interval();
	}